

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O1

void writeKeys(string *str,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *keys,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  pointer pbVar1;
  size_type sVar2;
  int *piVar3;
  bool bVar4;
  unsigned_long __val;
  size_t __val_00;
  long *plVar5;
  unsigned_long uVar6;
  long *plVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  char cVar11;
  size_type sVar12;
  char cVar13;
  string *key;
  pointer pbVar14;
  int *val;
  int *piVar15;
  string *__range2;
  ulong uVar16;
  string __str;
  size_t num_chars;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  vector<int,_std::allocator<int>_> *__range1;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  uint local_a0;
  long local_98 [2];
  unsigned_long local_88;
  size_t local_80;
  void *local_78;
  iterator iStack_70;
  unsigned_long *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<int,_std::allocator<int>_> *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_88 = 0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_68 = (unsigned_long *)0x0;
  local_78 = (void *)0x0;
  iStack_70._M_current = (unsigned_long *)0x0;
  pbVar14 = (keys->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_80 = n;
  local_40 = mapping;
  local_38 = keys;
  if (pbVar14 != pbVar1) {
    do {
      if (iStack_70._M_current == local_68) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,iStack_70,
                   &local_88);
      }
      else {
        *iStack_70._M_current = local_88;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      local_e8 = (long *)pbVar14->_M_string_length;
      local_88 = local_88 + (long)local_e8;
      if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_e8);
      }
      else {
        *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_e8;
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != pbVar1);
  }
  __val = local_88;
  cVar11 = '\x01';
  if (9 < local_88) {
    uVar6 = local_88;
    cVar13 = '\x04';
    do {
      cVar11 = cVar13;
      if (uVar6 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_0010487d;
      }
      if (uVar6 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_0010487d;
      }
      if (uVar6 < 10000) goto LAB_0010487d;
      bVar4 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar13 = cVar11 + '\x04';
    } while (bVar4);
    cVar11 = cVar11 + '\x01';
  }
LAB_0010487d:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8,local_a0,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1160a0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_b8 = *plVar7;
    lStack_b0 = plVar5[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar7;
    local_c8 = (long *)*plVar5;
  }
  local_c0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_e8 = &local_d8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_d8 = *plVar7;
    lStack_d0 = plVar5[3];
  }
  else {
    local_d8 = *plVar7;
    local_e8 = (long *)*plVar5;
  }
  local_e0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)str,(ulong)local_e8);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  pbVar1 = (local_38->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar14 = (local_38->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar1;
      pbVar14 = pbVar14 + 1) {
    cVar11 = '\b';
    do {
      cVar13 = (char)str;
      std::__cxx11::string::push_back(cVar13);
      cVar11 = cVar11 + -1;
    } while (cVar11 != '\0');
    sVar2 = pbVar14->_M_string_length;
    if (sVar2 != 0) {
      sVar12 = 0;
      do {
        std::__cxx11::string::push_back(cVar13);
        std::__cxx11::string::push_back(cVar13);
        std::__cxx11::string::push_back(cVar13);
        std::__cxx11::string::push_back(cVar13);
        sVar12 = sVar12 + 1;
      } while (sVar2 != sVar12);
    }
    std::__cxx11::string::push_back(cVar13);
  }
  std::__cxx11::string::append((char *)str);
  uVar16 = local_80 + 1;
  cVar11 = '\x01';
  if (9 < uVar16) {
    uVar8 = uVar16;
    cVar13 = '\x04';
    do {
      cVar11 = cVar13;
      if (uVar8 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00104ab2;
      }
      if (uVar8 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00104ab2;
      }
      if (uVar8 < 10000) goto LAB_00104ab2;
      bVar4 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar13 = cVar11 + '\x04';
    } while (bVar4);
    cVar11 = cVar11 + '\x01';
  }
LAB_00104ab2:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8,local_a0,uVar16);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1160d6);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_b8 = *plVar7;
    lStack_b0 = plVar5[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar7;
    local_c8 = (long *)*plVar5;
  }
  local_c0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_e8 = &local_d8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_d8 = *plVar7;
    lStack_d0 = plVar5[3];
  }
  else {
    local_d8 = *plVar7;
    local_e8 = (long *)*plVar5;
  }
  local_e0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)str,(ulong)local_e8);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  local_80 = uVar16;
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  piVar15 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar15 != piVar3) {
    uVar16 = 0;
    do {
      if ((uVar16 != 0) && (uVar16 == (uVar16 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)str);
      }
      if (*piVar15 == -1) {
        std::__cxx11::string::append((char *)str);
      }
      else {
        uVar8 = *(ulong *)((long)local_78 + (long)*piVar15 * 8);
        cVar11 = '\x01';
        if (9 < uVar8) {
          uVar10 = uVar8;
          cVar13 = '\x04';
          do {
            cVar11 = cVar13;
            if (uVar10 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00104cce;
            }
            if (uVar10 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00104cce;
            }
            if (uVar10 < 10000) goto LAB_00104cce;
            bVar4 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar13 = cVar11 + '\x04';
          } while (bVar4);
          cVar11 = cVar11 + '\x01';
        }
LAB_00104cce:
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct((ulong)&local_c8,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c8,(uint)local_c0,uVar8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_e8 = &local_d8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_d8 = *plVar7;
          lStack_d0 = plVar5[3];
        }
        else {
          local_d8 = *plVar7;
          local_e8 = (long *)*plVar5;
        }
        local_e0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)str,(ulong)local_e8);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
      }
      uVar16 = uVar16 + 1;
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar3);
  }
  std::__cxx11::string::append((char *)str);
  __val_00 = local_80;
  cVar11 = '\x01';
  if (9 < local_80) {
    sVar9 = local_80;
    cVar13 = '\x04';
    do {
      cVar11 = cVar13;
      if (sVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00104e0e;
      }
      if (sVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00104e0e;
      }
      if (sVar9 < 10000) goto LAB_00104e0e;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar13 = cVar11 + '\x04';
    } while (bVar4);
    cVar11 = cVar11 + '\x01';
  }
LAB_00104e0e:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8,local_a0,__val_00);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1160d6);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_b8 = *plVar7;
    lStack_b0 = plVar5[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar7;
    local_c8 = (long *)*plVar5;
  }
  local_c0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_e8 = &local_d8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_d8 = *plVar7;
    lStack_d0 = plVar5[3];
  }
  else {
    local_d8 = *plVar7;
    local_e8 = (long *)*plVar5;
  }
  local_e0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)str,(ulong)local_e8);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  piVar15 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar15 != piVar3) {
    uVar16 = 0;
    do {
      if ((uVar16 != 0) && (uVar16 == (uVar16 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)str);
      }
      if (*piVar15 == -1) {
        std::__cxx11::string::append((char *)str);
      }
      else {
        uVar8 = local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar15];
        cVar11 = '\x01';
        if (9 < uVar8) {
          uVar10 = uVar8;
          cVar13 = '\x04';
          do {
            cVar11 = cVar13;
            if (uVar10 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00105026;
            }
            if (uVar10 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00105026;
            }
            if (uVar10 < 10000) goto LAB_00105026;
            bVar4 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar13 = cVar11 + '\x04';
          } while (bVar4);
          cVar11 = cVar11 + '\x01';
        }
LAB_00105026:
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct((ulong)&local_c8,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c8,(uint)local_c0,uVar8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_e8 = &local_d8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_d8 = *plVar7;
          lStack_d0 = plVar5[3];
        }
        else {
          local_d8 = *plVar7;
          local_e8 = (long *)*plVar5;
        }
        local_e0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)str,(ulong)local_e8);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
      }
      uVar16 = uVar16 + 1;
      piVar15 = piVar15 + 1;
    } while (piVar15 != piVar3);
  }
  std::__cxx11::string::append((char *)str);
  std::__cxx11::string::append((char *)str);
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<std::string>& keys,
               const std::vector<int>& mapping,
               size_t n){
    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& key : keys){
        start.push_back(num_chars);
        num_chars += key.size();
        sze.push_back(key.size());
    }

    str += "    static constexpr std::array<char, " + std::to_string(num_chars) + "> flat_keys {\n";
    for(const std::string& key : keys){
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        for(const char& ch : key){
            str.push_back('\'');
            str.push_back(ch);
            str.push_back('\'');
            str.push_back(',');
        }
        str.push_back('\n');
    }
    str += "    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> key_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static inline bool checkBin(const std::string& key, size_t bin) noexcept{\n"
           "        const auto& size = key_size[bin];\n"
           "        if(size != key.size()) return false;\n"
           "        const auto& start = key_start[bin];\n"
           "        for(size_t i = size-1; i < std::numeric_limits<size_t>::max(); i--)\n"
           "            if(key[i] != flat_keys[start+i]) return false;\n"
           "        return true;\n"
           "    }\n";
}